

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

void __thiscall
args::Matcher::
Matcher<std::__detail::_Node_iterator<char,true,false>,std::__detail::_Node_iterator<std::__cxx11::string,true,true>>
          (Matcher *this,_Node_iterator<char,_true,_false> shortFlagsStart,
          _Node_iterator<char,_true,_false> shortFlagsEnd,
          _Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
          longFlagsStart,
          _Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
          longFlagsEnd)

{
  bool bVar1;
  UsageError *this_00;
  allocator local_91;
  string local_90;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_6b;
  key_equal local_6a;
  hasher local_69;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_68;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_60;
  allocator_type local_43;
  key_equal local_42;
  hasher local_41;
  _Node_iterator_base<char,_false> local_40;
  _Node_iterator_base<char,_false> local_38;
  Matcher *local_30;
  Matcher *this_local;
  _Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
  longFlagsEnd_local;
  _Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
  longFlagsStart_local;
  _Node_iterator<char,_true,_false> shortFlagsEnd_local;
  _Node_iterator<char,_true,_false> shortFlagsStart_local;
  
  local_40 = shortFlagsEnd.super__Node_iterator_base<char,_false>._M_cur;
  local_38 = shortFlagsStart.super__Node_iterator_base<char,_false>._M_cur;
  local_30 = this;
  this_local = (Matcher *)
               longFlagsEnd.
               super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ._M_cur;
  longFlagsEnd_local = longFlagsStart;
  std::allocator<char>::allocator();
  std::unordered_set<char,std::hash<char>,std::equal_to<char>,std::allocator<char>>::
  unordered_set<std::__detail::_Node_iterator<char,true,false>>
            ((unordered_set<char,std::hash<char>,std::equal_to<char>,std::allocator<char>> *)this,
             (_Node_iterator<char,_true,_false>)local_38._M_cur,
             (_Node_iterator<char,_true,_false>)local_40._M_cur,0,&local_41,&local_42,&local_43);
  std::allocator<char>::~allocator(&local_43);
  local_60 = longFlagsEnd_local.
             super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ._M_cur;
  local_68._M_cur = (__node_type *)this_local;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_6b);
  std::
  unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::unordered_set<std::__detail::_Node_iterator<std::__cxx11::string,true,true>>
            ((unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&this->longFlags,
             (_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
              )local_60._M_cur,
             (_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
              )local_68._M_cur,0,&local_69,&local_6a,&local_6b);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_6b);
  bVar1 = std::unordered_set<char,_std::hash<char>,_std::equal_to<char>,_std::allocator<char>_>::
          empty(&this->shortFlags);
  if ((bVar1) &&
     (bVar1 = std::
              unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(&this->longFlags), bVar1)) {
    this_00 = (UsageError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_90,"empty Matcher",&local_91);
    UsageError::UsageError(this_00,&local_90);
    __cxa_throw(this_00,&UsageError::typeinfo,UsageError::~UsageError);
  }
  return;
}

Assistant:

Matcher(ShortIt shortFlagsStart, ShortIt shortFlagsEnd, LongIt longFlagsStart, LongIt longFlagsEnd) :
                shortFlags(shortFlagsStart, shortFlagsEnd),
                longFlags(longFlagsStart, longFlagsEnd)
            {
                if (shortFlags.empty() && longFlags.empty())
                {
#ifndef ARGS_NOEXCEPT
                    throw UsageError("empty Matcher");
#endif
                }
            }